

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::ComputeTargetObjectDirectory
          (cmGlobalGhsMultiGenerator *this,cmGeneratorTarget *gt)

{
  string *psVar1;
  string dir;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  long *local_30 [2];
  long local_20 [2];
  
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)(psVar1->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_50);
  (*gt->LocalGenerator->_vptr_cmLocalGenerator[0xc])(local_30,gt->LocalGenerator,gt);
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_30[0]);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::_M_assign((string *)&gt->ObjectDirectory);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir;
  dir += gt->LocalGenerator->GetCurrentBinaryDirectory();
  dir += "/";
  dir += gt->LocalGenerator->GetTargetDirectory(gt);
  dir += "/";
  gt->ObjectDirectory = dir;
}